

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# channel.c
# Opt level: O2

int mgr_process(chmgr *chmgr,int idx)

{
  ssize_t sVar1;
  char *name;
  char *__s;
  size_t sVar2;
  ftmgr *pfVar3;
  uint32_t *payload;
  int *piVar4;
  char *pcVar5;
  uint8_t *__ptr;
  uint uVar6;
  uint32_t mode;
  char buf [1024];
  
  sVar1 = read(chmgr->fds[0].fd,buf,0x400);
  uVar6 = (uint)sVar1;
  if (0 < (int)uVar6) {
    buf[uVar6 & 0x7fffffff] = '\0';
    name = strtok(buf," \n");
    __s = strtok((char *)0x0," \n");
    if (__s == (char *)0x0) {
      __s = name;
    }
    mgr_print(chmgr,"send %s to %s\n",name,__s);
    if (chmgr->ftmgr != (ftmgr *)0x0) {
      free_ftmgr(&chmgr->ftmgr);
    }
    sVar2 = strlen(__s);
    pfVar3 = alloc_ftmgr(name,chmgr,&mode);
    chmgr->ftmgr = pfVar3;
    if (pfVar3 == (ftmgr *)0x0) {
      piVar4 = __errno_location();
      pcVar5 = strerror(*piVar4);
      mgr_print(chmgr,"send %s to %s: %s\n",name,__s,pcVar5);
      uVar6 = 0xffffffff;
    }
    else {
      uVar6 = ((int)sVar2 + 1U & 0xff) + 4;
      payload = (uint32_t *)malloc((ulong)uVar6);
      *payload = mode;
      strcpy((char *)(payload + 1),__s);
      uVar6 = fm_write(chmgr,0x80,payload,(uint16_t)uVar6);
      free(payload);
    }
  }
  return uVar6;
}

Assistant:

static int mgr_process(struct chmgr *chmgr, int idx __unused)
{
    int ret = 0;
    char buf[1024];
    char *lname, *rname;

    if(0 < (ret = read(chmgr->fds[CTRL_MGR].fd, buf, 1024))) {
        buf[ret] =  '\0';
        lname = strtok(buf, " \n");
        rname = strtok(NULL, " \n");

        if(rname == NULL)
            rname = lname;

        mgr_print(chmgr, "send %s to %s\n", lname, rname);

        if(chmgr->ftmgr != NULL)
            free_ftmgr(&chmgr->ftmgr);
        if(0 > (ret = fstat_req(chmgr, lname, rname))) {
            mgr_print(chmgr, "send %s to %s: %s\n", lname, rname, strerror(errno));
        }
    }
    return ret;
}